

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_avx2_mula2(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  long lVar5;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined1 auVar6 [16];
  int j_2;
  size_t i_2;
  uint16_t tmp [16];
  int j_1;
  __m256i bit;
  int j;
  __m256i input;
  size_t i;
  size_t i_1;
  __m256i counters [16];
  int local_45c;
  ulong local_458;
  long local_450;
  long lStack_448;
  long lStack_440;
  long lStack_438;
  int local_424;
  int local_3e4;
  undefined1 local_3e0 [32];
  ulong local_3b0;
  ulong local_3a8;
  long local_3a0 [65];
  uint local_194;
  long local_190;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  
  local_3a0[0x40] = in_RDX;
  local_194 = in_ESI;
  local_190 = in_RDI;
  for (local_3a8 = 0; local_3a8 < 0x10; local_3a8 = local_3a8 + 1) {
    local_3a0[local_3a8 * 4] = 0;
    local_3a0[local_3a8 * 4 + 1] = 0;
    local_3a0[local_3a8 * 4 + 2] = 0;
    local_3a0[local_3a8 * 4 + 3] = 0;
  }
  for (local_3b0 = 0; local_3b0 + 0x10 <= (ulong)local_194; local_3b0 = local_3b0 + 0x10) {
    local_3e0 = *(undefined1 (*) [32])(local_190 + local_3b0 * 2);
    for (local_3e4 = 0; local_3e4 < 0x10; local_3e4 = local_3e4 + 1) {
      auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar1 = vpinsrw_avx(auVar1,1,2);
      auVar1 = vpinsrw_avx(auVar1,1,3);
      auVar1 = vpinsrw_avx(auVar1,1,4);
      auVar1 = vpinsrw_avx(auVar1,1,5);
      auVar1 = vpinsrw_avx(auVar1,1,6);
      auVar1 = vpinsrw_avx(auVar1,1,7);
      auVar2 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar2 = vpinsrw_avx(auVar2,1,2);
      auVar2 = vpinsrw_avx(auVar2,1,3);
      auVar2 = vpinsrw_avx(auVar2,1,4);
      auVar2 = vpinsrw_avx(auVar2,1,5);
      auVar2 = vpinsrw_avx(auVar2,1,6);
      auVar2 = vpinsrw_avx(auVar2,1,7);
      auVar6 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
      uStack_b0 = auVar6._0_8_;
      uStack_a8 = auVar6._8_8_;
      auVar3._16_8_ = uStack_b0;
      auVar3._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
      auVar3._24_8_ = uStack_a8;
      auVar3 = vpand_avx2(local_3e0,auVar3);
      lVar5 = (long)local_3e4;
      auVar4._8_8_ = local_3a0[lVar5 * 4 + 1];
      auVar4._0_8_ = local_3a0[lVar5 * 4];
      auVar4._16_8_ = local_3a0[lVar5 * 4 + 2];
      auVar4._24_8_ = local_3a0[lVar5 * 4 + 3];
      auVar3 = vpaddw_avx2(auVar4,auVar3);
      *(undefined1 (*) [32])(local_3a0 + (long)local_3e4 * 4) = auVar3;
      local_3e0 = vpsrlw_avx2(local_3e0,ZEXT416(1));
    }
  }
  for (; local_3b0 < local_194; local_3b0 = local_3b0 + 1) {
    for (local_424 = 0; local_424 < 0x10; local_424 = local_424 + 1) {
      *(int *)(local_3a0[0x40] + (long)local_424 * 4) =
           ((int)((uint)*(ushort *)(local_190 + local_3b0 * 2) & 1 << ((byte)local_424 & 0x1f)) >>
           ((byte)local_424 & 0x1f)) + *(int *)(local_3a0[0x40] + (long)local_424 * 4);
    }
  }
  for (local_458 = 0; local_458 < 0x10; local_458 = local_458 + 1) {
    local_450 = local_3a0[local_458 * 4];
    lStack_448 = local_3a0[local_458 * 4 + 1];
    lStack_440 = local_3a0[local_458 * 4 + 2];
    lStack_438 = local_3a0[local_458 * 4 + 3];
    for (local_45c = 0; local_45c < 0x10; local_45c = local_45c + 1) {
      *(uint *)(local_3a0[0x40] + local_458 * 4) =
           (uint)*(ushort *)((long)&local_450 + (long)local_45c * 2) +
           *(int *)(local_3a0[0x40] + local_458 * 4);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_mula2(const uint16_t* array, uint32_t len, uint32_t* flags) {
    __m256i counters[16];

    for (size_t i = 0; i < 16; ++i) {
        counters[i] = _mm256_setzero_si256();
    }

    size_t i = 0;
    for (/**/; i + 16 <= len; i += 16) {
        __m256i input = _mm256_loadu_si256((__m256i*)(array + i));

        for (int j = 0; j < 16; ++j) {
            __m256i bit = _mm256_and_si256(input, _mm256_set1_epi16(1));
            counters[j] = _mm256_add_epi16(counters[j], bit);
            input = _mm256_srli_epi16(input, 1);
        }
    }

     // residual
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

    uint16_t tmp[16];
    for (size_t i = 0; i < 16; ++i) {
        _mm256_storeu_si256((__m256i*)tmp, counters[i]);
        for (int j=0; j < 16; ++j)
            flags[i] += tmp[j];
    }
    return 0;
}